

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall
Clasp::Constraint::minimize(Constraint *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  size_type sVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  LitVec temp;
  ebo local_38;
  
  local_38.buf = (pointer)0x0;
  local_38.size = 0;
  local_38.cap = 0;
  (*this->_vptr_Constraint[1])(this,s,CONCAT44(in_register_00000014,p.rep_));
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    sVar1 = local_38.size;
    if (uVar4 == local_38.size) break;
    bVar3 = Solver::ccMinimize(s,(Literal)local_38.buf[uVar4].rep_,rec);
    uVar2 = uVar4 + 1;
  } while (bVar3);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&local_38);
  return uVar4 == sVar1;
}

Assistant:

bool Constraint::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	LitVec temp;
	reason(s, p, temp);
	for (LitVec::size_type i = 0; i != temp.size(); ++i) {
		if (!s.ccMinimize(temp[i], rec)) {
			return false;
		}
	}
	return true;
}